

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_8x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int bit;
  int bit_00;
  int bit_01;
  int bit_02;
  int fliplr;
  int shift;
  __m128i out [16];
  __m128i in [16];
  
  piVar2 = av1_fwd_txfm_shift_ls[1];
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_8x8(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fdct8x8_sse4_1(in,out,0xd,2);
    goto LAB_00390eb8;
  case 1:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
    goto LAB_00390e92;
  case 2:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
    goto LAB_00390f05;
  case 3:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
    goto LAB_0039101d;
  case 4:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
LAB_00390e92:
    load_buffer_8x8(input,in,stride,iVar3,0,(int)cVar1);
    fadst8x8_sse4_1(in,out,0xd,2);
LAB_00390eb8:
    col_txfm_8x8_rounding(out,-(int)piVar2[1]);
    transpose_8x8(out,in);
LAB_00390ee5:
    fdct8x8_sse4_1(in,out,0xd,2);
    goto LAB_00391075;
  case 5:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
LAB_00390f05:
    load_buffer_8x8(input,in,stride,0,iVar3,(int)cVar1);
    fdct8x8_sse4_1(in,out,0xd,2);
    goto LAB_00391043;
  case 6:
    shift = (int)*av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
    fliplr = iVar3;
    break;
  case 7:
    shift = (int)*av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
    fliplr = 1;
    break;
  case 8:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
LAB_0039101d:
    shift = (int)cVar1;
    fliplr = 0;
    break;
  case 9:
    load_buffer_8x8(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    idtx8x8_sse4_1(in,out,bit_00,2);
    goto LAB_00390fe1;
  case 10:
    load_buffer_8x8(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    fdct8x8_sse4_1(in,out,0xd,2);
    goto LAB_00390fe1;
  case 0xb:
    load_buffer_8x8(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[1]);
    idtx8x8_sse4_1(in,out,bit,2);
    col_txfm_8x8_rounding(out,-(int)piVar2[1]);
    transpose_8x8(out,in);
    goto LAB_00390ee5;
  case 0xc:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
    goto LAB_00390dbc;
  case 0xd:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 0;
    goto LAB_00390f42;
  case 0xe:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
LAB_00390dbc:
    load_buffer_8x8(input,in,stride,iVar3,0,(int)cVar1);
    fadst8x8_sse4_1(in,out,0xd,2);
LAB_00390fe1:
    col_txfm_8x8_rounding(out,-(int)piVar2[1]);
    transpose_8x8(out,in);
    idtx8x8_sse4_1(in,out,bit_02,2);
    goto LAB_00391075;
  case 0xf:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    iVar3 = 1;
LAB_00390f42:
    load_buffer_8x8(input,in,stride,0,iVar3,(int)cVar1);
    idtx8x8_sse4_1(in,out,bit_01,2);
    col_txfm_8x8_rounding(out,-(int)piVar2[1]);
    transpose_8x8(out,in);
    goto LAB_00391070;
  }
  load_buffer_8x8(input,in,stride,iVar3,fliplr,shift);
  fadst8x8_sse4_1(in,out,0xd,2);
LAB_00391043:
  col_txfm_8x8_rounding(out,-(int)piVar2[1]);
  transpose_8x8(out,in);
LAB_00391070:
  fadst8x8_sse4_1(in,out,0xd,2);
LAB_00391075:
  write_buffer_8x8(out,coeff);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case IDTX:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}